

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O0

cmExportBuildFileGenerator * __thiscall
cmGlobalGenerator::GetExportedTargetsFile(cmGlobalGenerator *this,string *filename)

{
  bool bVar1;
  pointer ppVar2;
  cmExportBuildFileGenerator *local_38;
  _Self local_28;
  _Self local_20;
  const_iterator it;
  string *filename_local;
  cmGlobalGenerator *this_local;
  
  it._M_node = (_Base_ptr)filename;
  local_20._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportBuildFileGenerator_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportBuildFileGenerator_*>_>_>
       ::find(&this->BuildExportSets,filename);
  local_28._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportBuildFileGenerator_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportBuildFileGenerator_*>_>_>
       ::end(&this->BuildExportSets);
  bVar1 = std::operator==(&local_20,&local_28);
  if (bVar1) {
    local_38 = (cmExportBuildFileGenerator *)0x0;
  }
  else {
    ppVar2 = std::
             _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportBuildFileGenerator_*>_>
             ::operator->(&local_20);
    local_38 = ppVar2->second;
  }
  return local_38;
}

Assistant:

cmExportBuildFileGenerator* cmGlobalGenerator::GetExportedTargetsFile(
  const std::string& filename) const
{
  std::map<std::string, cmExportBuildFileGenerator*>::const_iterator it =
    this->BuildExportSets.find(filename);
  return it == this->BuildExportSets.end() ? CM_NULLPTR : it->second;
}